

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

FunctionBodyResolveInfo * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::NextOpenEntry
          (UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL> *this)

{
  FunctionBodyResolveInfo *pFVar1;
  FunctionBodyResolveInfo *pFVar2;
  
  pFVar1 = (this->m_inlineHeadBlock).CurrPos;
  pFVar2 = (this->m_inlineHeadBlock).EndPos;
  if ((pFVar1 <= pFVar2) &&
     ((ulong)((long)pFVar1 - (long)(this->m_inlineHeadBlock).BlockData) < 0x28050)) {
    if (pFVar1 == pFVar2) {
      AddArrayLink(this);
    }
    pFVar1 = (this->m_inlineHeadBlock).CurrPos;
    (this->m_inlineHeadBlock).CurrPos = pFVar1 + 1;
    return pFVar1;
  }
  TTDAbort_unrecoverable_error("We are off the end of the array");
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }